

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_2.cpp
# Opt level: O1

int evaluate(int a,int b,char op)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined7 in_register_00000011;
  long lVar2;
  char *pcVar3;
  int iVar4;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  switch((int)CONCAT71(in_register_00000011,op)) {
  case 0x2a:
    iVar4 = b * a;
    break;
  case 0x2b:
    iVar4 = b + a;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Oh noez! I do not know this operator. ",0x26);
    uStack_18._0_7_ = CONCAT16(op,(undefined6)uStack_18);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)((long)&uStack_18 + 6),1);
    pcVar3 = (char *)((long)&uStack_18 + 7);
    uStack_18 = CONCAT17(10,(undefined7)uStack_18);
    lVar2 = 1;
    goto LAB_00101350;
  case 0x2d:
    iVar4 = a - b;
    break;
  case 0x2f:
    if (b != 0) {
      return a / b;
    }
    poVar1 = (ostream *)&std::cerr;
    pcVar3 = "Oh, you cannot device by 0\n";
    lVar2 = 0x1b;
LAB_00101350:
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int evaluate(int a, int b, char op)
{
	switch (op)
	{
		case '+':
			return a + b;
		case '-':
			return a - b;
		case '*':
			return a * b;
		case '/':
			if (b != 0)
				return a / b;
			cerr << "Oh, you cannot device by 0\n";
			break;
		default:
			cerr << "Oh noez! I do not know this operator. " << op << '\n';
			break;
	}
	return 0; // failure case
}